

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsHasOwnItem(JsValueRef object,uint32_t index,bool *hasOwnItem)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  JsErrorCode exitStatus;
  BOOL BVar2;
  JsrtContext *currentContext;
  RecyclableObject *pRVar3;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,true,false);
  if (exitStatus != JsNoError) goto LAB_003b1d21;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (object == (JsValueRef)0x0) {
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    BVar2 = Js::JavascriptOperators::IsObject(object);
    if (BVar2 == 0) {
      exitStatus = JsErrorArgumentNotObject;
    }
    else {
      pRVar3 = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b1d0f;
        object = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
      }
      if (hasOwnItem == (bool *)0x0) {
        exitStatus = JsErrorNullArgument;
      }
      else {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(object);
        BVar2 = Js::JavascriptOperators::HasOwnItem(pRVar3,index);
        *hasOwnItem = BVar2 != 0;
        exitStatus = JsNoError;
      }
    }
  }
LAB_003b1d0f:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
LAB_003b1d21:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API
JsHasOwnItem(_In_ JsValueRef object,
    _In_ uint32_t index,
    _Out_ bool* hasOwnItem)
{
  return ContextAPIWrapper<true>(
      [&](Js::ScriptContext* scriptContext,
          TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(hasOwnItem);

        *hasOwnItem = !!Js::JavascriptOperators::HasOwnItem(
            Js::VarTo<Js::RecyclableObject>(object), index);

        return JsNoError;
      });
}